

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdnslookup_unix.cpp
# Opt level: O3

void __thiscall QDnsLookupRunnable::query(QDnsLookupRunnable *this,QDnsLookupReply *reply)

{
  long lVar1;
  long lVar2;
  Data *__s;
  uchar *puVar3;
  ulong uVar4;
  byte bVar5;
  uchar uVar6;
  ushort uVar7;
  undefined2 uVar8;
  uint uVar9;
  undefined4 uVar10;
  long lVar11;
  QArrayData *pQVar12;
  QDnsCachedName *pQVar13;
  QString *pQVar14;
  QSharedDataPointer<QDnsTextRecordPrivate> QVar15;
  QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate> QVar16;
  qsizetype qVar17;
  QDnsTlsAssociationRecord QVar18;
  QDnsLookupReply *pQVar19;
  undefined8 uVar20;
  bool bVar21;
  ushort uVar22;
  int iVar23;
  uint uVar24;
  NetworkLayerProtocol NVar25;
  quint32 qVar26;
  uint uVar27;
  ulong uVar28;
  long lVar29;
  ushort uVar30;
  ushort uVar31;
  int iVar32;
  char *pcVar33;
  QDnsTextRecord QVar34;
  long lVar35;
  char16_t *pcVar36;
  long lVar37;
  QHostAddress *this_00;
  QList<QDnsDomainNameRecord> *this_01;
  long in_FS_OFFSET;
  QSpan<unsigned_char,_18446744073709551615UL> query;
  QDnsTextRecord record_1;
  QDnsTlsAssociationRecord record;
  char16_t *pcStack_910;
  qsizetype local_908;
  QString local_8f8;
  QString local_8e0;
  anon_class_56_5_c3b57c2e local_8c8;
  int status;
  uint local_88c;
  QDnsLookupReply *reply_local;
  uchar *response;
  undefined1 local_878 [1256];
  QueryBuffer qbuffer;
  remove_pointer_t<res_state> state;
  
  lVar11 = *(long *)(in_FS_OFFSET + 0x28);
  reply_local = reply;
  memcpy(&state,&DAT_0027b978,0x238);
  iVar23 = __res_ninit(&state);
  if (iVar23 < 0) {
    QDnsLookupRunnable::query((QDnsLookupRunnable *)&reply_local);
    goto LAB_00232f71;
  }
  memset((QArrayData *)&qbuffer,0xaa,0x120);
  pcVar33 = (this->requestName).d.ptr;
  if (pcVar33 == (char *)0x0) {
    pcVar33 = (char *)&QByteArray::_empty;
  }
  uVar24 = res_nmkquery(&state,0,pcVar33,1,this->requestType,0,0,0,(QArrayData *)&qbuffer,0x120);
  if ((int)uVar24 < 0) {
LAB_00232f96:
    QDnsLookupReply::makeResolverSystemError(reply_local,-1);
  }
  else {
    puVar3 = qbuffer._M_elems + uVar24;
    puVar3[0] = '\0';
    puVar3[1] = '\0';
    puVar3[2] = ')';
    puVar3[3] = '\x04';
    puVar3[4] = 0xd0;
    puVar3[5] = '\0';
    puVar3[6] = '\0';
    puVar3[7] = '\0';
    puVar3 = qbuffer._M_elems + (ulong)uVar24 + 7;
    puVar3[0] = '\0';
    puVar3[1] = '\0';
    puVar3[2] = '\0';
    puVar3[3] = '\0';
    qbuffer._M_elems[10] = '\0';
    qbuffer._M_elems[0xb] = '\x01';
    uVar24 = uVar24 + 0xb;
    if ((int)uVar24 < 0) goto LAB_00232f96;
    __s = (Data *)(local_878 + 0x18);
    memset(__s,0xaa,0x4d0);
    pQVar19 = reply_local;
    local_878._0_8_ = (char16_t *)0x4d0;
    local_878._8_8_ = 0x4d0;
    local_88c = 0xffffffff;
    local_878._16_8_ = __s;
    if (this->protocol == DnsOverTls) {
      query.super_QSpanBase<unsigned_char,_18446744073709551615UL>.m_size._0_4_ = uVar24;
      query.super_QSpanBase<unsigned_char,_18446744073709551615UL>.m_data = qbuffer._M_elems;
      query.super_QSpanBase<unsigned_char,_18446744073709551615UL>.m_size._4_4_ = 0;
      bVar21 = sendDnsOverTls(this,reply_local,query,(ReplyBuffer *)local_878);
      if (bVar21) {
        uVar24 = local_878._8_4_;
        goto LAB_00231f92;
      }
    }
    else if (this->protocol == Standard) {
      uVar22 = this->port;
      this_00 = &this->nameserver;
      record.d.d.ptr =
           (QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>)
           (QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>)reply_local;
      local_8f8.d.d = (Data *)&qbuffer;
      local_8f8.d.ptr = (char16_t *)(ulong)uVar24;
      response = (uchar *)&state;
      bVar21 = QHostAddress::isNull(this_00);
      if (!bVar21) {
        state.nscount = 1;
        state.nsaddr_list[0].sin_family = 0;
        NVar25 = QHostAddress::protocol(this_00);
        if (NVar25 == IPv6Protocol) {
          bVar21 = setIpv6NameServer<__res_state>(&state,this_00,uVar22);
          if (!bVar21) {
            uVar24 = 0xffffffff;
            QMetaObject::tr((char *)&local_8c8,(char *)&QDnsLookup::staticMetaObject,0x27bcd5);
            pQVar19->error = ResolverError;
            pQVar12 = &((pQVar19->errorString).d.d)->super_QArrayData;
            (pQVar19->errorString).d.d = (Data *)local_8c8.cache.d.d;
            pQVar13 = (QDnsCachedName *)(pQVar19->errorString).d.ptr;
            (pQVar19->errorString).d.ptr = (char16_t *)local_8c8.cache.d.ptr;
            pQVar14 = (QString *)(pQVar19->errorString).d.size;
            (pQVar19->errorString).d.size = local_8c8.cache.d.size;
            local_8c8.cache.d.d = (Data *)pQVar12;
            local_8c8.cache.d.ptr = pQVar13;
            local_8c8.cache.d.size = (qsizetype)pQVar14;
            if (pQVar12 != (QArrayData *)0x0) {
              LOCK();
              (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar12->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pQVar12->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(pQVar12,2,0x10);
              }
            }
            goto LAB_00231f92;
          }
        }
        else {
          state.nsaddr_list[0].sin_zero[4] = '\0';
          state.nsaddr_list[0].sin_zero[5] = '\0';
          state.nsaddr_list[0].sin_zero[6] = '\0';
          state.nsaddr_list[0].sin_zero[7] = '\0';
          state.nsaddr_list[0].sin_addr.s_addr = 0;
          state.nsaddr_list[0].sin_zero[0] = '\0';
          state.nsaddr_list[0].sin_zero[1] = '\0';
          state.nsaddr_list[0].sin_zero[2] = '\0';
          state.nsaddr_list[0].sin_zero[3] = '\0';
          state.nsaddr_list[0].sin_family = 2;
          state.nsaddr_list[0].sin_port = uVar22 << 8 | uVar22 >> 8;
          qVar26 = QHostAddress::toIPv4Address(this_00,(bool *)0x0);
          state.nsaddr_list[0].sin_addr.s_addr =
               qVar26 >> 0x18 | (qVar26 & 0xff0000) >> 8 | (qVar26 & 0xff00) << 8 | qVar26 << 0x18;
        }
        uVar4._0_4_ = ((QArrayData *)local_878._16_8_)->ref_;
        uVar4._4_4_ = ((QArrayData *)local_878._16_8_)->flags;
        ((QArrayData *)local_878._16_8_)->ref_ = (QBasicAtomicInt)(int)(uVar4 | 0x20000000);
        ((QArrayData *)local_878._16_8_)->flags = (ArrayOptions)(int)((uVar4 | 0x20000000) >> 0x20);
        state.options = state.options | 0x4000000;
      }
      local_8c8.cache.d.d = (Data *)local_878;
      local_8c8.cache.d.ptr = (QDnsCachedName *)&response;
      local_8c8.cache.d.size = (qsizetype)&local_8f8;
      local_8c8.response = (uchar **)&record;
      state.options = state.options | 0x20;
      uVar27 = sendStandardDns::anon_class_32_4_ea28d3fd::operator()
                         ((anon_class_32_4_ea28d3fd *)&local_8c8);
      uVar24 = 0xffffffff;
      if (-1 < (int)uVar27) {
        uVar9 = *(uint *)&((QArrayData *)local_878._16_8_)->ref_;
        if ((uVar9 & 0xf020000) == 0x20000) {
          pcVar36 = (char16_t *)local_878._0_8_;
          if ((long)local_878._0_8_ < 0x10000) {
            pcVar36 = (char16_t *)0xffff;
          }
          QVLABase<unsigned_char>::reallocate_impl
                    ((QVLABase<unsigned_char> *)local_878,0x4d0,local_878 + 0x18,0xffff,
                     (qsizetype)pcVar36);
          uVar20 = local_878._16_8_;
          local_878._8_8_ = 0xffff;
          *(uint *)((long)local_8f8.d.d + 8) = (uint)(ushort)*(qsizetype *)((long)local_8f8.d.d + 8)
          ;
          local_8f8.d.ptr = (char16_t *)((long)local_8f8.d.ptr + -0xb);
          *(ulong *)(response + 8) = *(ulong *)(response + 8) | 8;
          uVar27 = sendStandardDns::anon_class_32_4_ea28d3fd::operator()
                             ((anon_class_32_4_ea28d3fd *)&local_8c8);
          if ((long)local_878._8_8_ < (long)(int)uVar27) {
            QDnsLookupRunnable::query((QDnsLookupRunnable *)&record);
            goto LAB_00231f92;
          }
          uVar10 = ((QArrayData *)uVar20)->ref_;
          uVar9 = uVar10;
        }
        *(byte *)((long)record.d.d.ptr + 4) = (byte)(uVar9 >> 0x1d) & 1;
        uVar24 = uVar27;
      }
LAB_00231f92:
      uVar20 = local_878._16_8_;
      local_88c = uVar24;
      if (-1 < (int)uVar24) {
        if (uVar24 < 0xc) {
          local_8c8.cache.d.d = (Data *)0x0;
          local_8c8.cache.d.ptr = (QDnsCachedName *)0x0;
          local_8c8.cache.d.size = 0;
          QDnsLookupReply::makeInvalidReplyError(reply_local,(QString *)&local_8c8);
          if (&(local_8c8.cache.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_8c8.cache.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_8c8.cache.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                 _M_i + -1;
            UNLOCK();
            if (((local_8c8.cache.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_8c8.cache.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        else {
          bVar5 = *(byte *)((long)&(((QArrayData *)local_878._16_8_)->ref_)._q_value.
                                   super___atomic_base<int>._M_i + 3);
          if ((bVar5 & 0xf) == 0) {
            local_8c8.response = &response;
            response = (uchar *)local_878._16_8_;
            local_8c8.status = &status;
            status = -0x55555556;
            local_8c8.cache.d.d = (Data *)0x0;
            local_8c8.cache.d.ptr = (QDnsCachedName *)0x0;
            local_8c8.cache.d.size = 0;
            local_8c8.responseLength = (int *)&local_88c;
            local_8c8.reply = &reply_local;
            uVar28._0_4_ = ((QArrayData *)local_878._16_8_)->ref_;
            uVar28._4_4_ = ((QArrayData *)local_878._16_8_)->flags;
            lVar37 = 0xc;
            if ((uVar28 & 0xffff00000000) == 0x10000000000) {
              QDnsLookupRunnable::query::anon_class_56_5_c3b57c2e::operator()
                        (&local_8e0,&local_8c8,0xc);
              if ((totally_ordered_wrapper<QHostAddressPrivate_*>)local_8e0.d.d !=
                  (totally_ordered_wrapper<QHostAddressPrivate_*>)0x0) {
                LOCK();
                *(int *)local_8e0.d.d = *(int *)local_8e0.d.d + -1;
                UNLOCK();
                if (*(int *)local_8e0.d.d == 0) {
                  QArrayData::deallocate(&(local_8e0.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (-1 < status) {
                lVar37 = (ulong)(uint)status + 0x10;
                pQVar12 = (QArrayData *)uVar20;
                uVar28._0_4_ = pQVar12->ref_;
                uVar28._4_4_ = pQVar12->flags;
                if ((int)local_88c < lVar37) {
                  uVar28 = uVar28 | 0xffff00000000;
                  pQVar12 = (QArrayData *)uVar20;
                  pQVar12->ref_ = (QBasicAtomicInt)(int)uVar28;
                  pQVar12->flags = (ArrayOptions)(int)(uVar28 >> 0x20);
                  lVar37 = 0xc;
                }
                goto LAB_00232123;
              }
            }
            else {
LAB_00232123:
              uVar22 = (ushort)(uVar28 >> 0x20);
              if ((ushort)(uVar22 << 8 | uVar22 >> 8) < 2) {
                if ((lVar37 < (int)local_88c) && (uVar28 >> 0x30 != 0)) {
                  uVar22 = (ushort)(uVar28 >> 0x30);
                  iVar23 = 0;
                  do {
                    local_8f8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                    local_8f8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                    local_8f8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                    QDnsLookupRunnable::query::anon_class_56_5_c3b57c2e::operator()
                              (&local_8f8,&local_8c8,lVar37);
                    pQVar19 = reply_local;
                    lVar29 = (long)status;
                    iVar32 = 1;
                    if (-1 < lVar29) {
                      lVar1 = lVar29 + lVar37;
                      lVar29 = lVar29 + lVar37;
                      lVar35 = lVar29 + 10;
                      lVar37 = lVar1;
                      if (lVar35 <= (int)local_88c) {
                        uVar7 = *(ushort *)(response + lVar1 + 8);
                        uVar31 = uVar7 << 8 | uVar7 >> 8;
                        lVar2 = lVar35 + (ulong)uVar31;
                        lVar37 = lVar35;
                        if (lVar2 <= (int)local_88c) {
                          if (*(short *)(response + lVar1 + 2) == 0x100) {
                            uVar30 = *(ushort *)(response + lVar1) << 8 |
                                     *(ushort *)(response + lVar1) >> 8;
                            uVar24 = *(uint *)(response + lVar1 + 4);
                            uVar24 = uVar24 >> 0x18 | (uVar24 & 0xff0000) >> 8 |
                                     (uVar24 & 0xff00) << 8 | uVar24 << 0x18;
                            if (uVar30 < 0xf) {
                              if (uVar30 < 5) {
                                if (uVar30 == 1) {
                                  if (uVar7 == 0x400) {
                                    uVar27 = *(uint *)(response + lVar35);
                                    record.d.d.ptr =
                                         (QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>
                                          )&DAT_aaaaaaaaaaaaaaaa;
                                    QDnsHostAddressRecord::QDnsHostAddressRecord
                                              ((QDnsHostAddressRecord *)&record);
                                    if (*(int *)record.d.d.ptr != 1) {
                                      QSharedDataPointer<QDnsHostAddressRecordPrivate>::
                                      detach_helper((
                                                  QSharedDataPointer<QDnsHostAddressRecordPrivate> *
                                                  )&record);
                                    }
                                    QString::operator=((QString *)((long)record.d.d.ptr + 8),
                                                       (QString *)&local_8f8);
                                    if (*(int *)record.d.d.ptr != 1) {
                                      QSharedDataPointer<QDnsHostAddressRecordPrivate>::
                                      detach_helper((
                                                  QSharedDataPointer<QDnsHostAddressRecordPrivate> *
                                                  )&record);
                                    }
                                    *(uint *)((long)record.d.d.ptr + 0x20) = uVar24;
                                    QHostAddress::QHostAddress
                                              ((QHostAddress *)&record_1,
                                               uVar27 >> 0x18 | (uVar27 & 0xff0000) >> 8 |
                                               (uVar27 & 0xff00) << 8 | uVar27 << 0x18);
                                    goto LAB_0023286d;
                                  }
                                  iVar32 = 0x27bbe6;
                                  goto LAB_00232a70;
                                }
                                if (uVar30 == 2) {
                                  record_1.d.d.ptr =
                                       (QSharedDataPointer<QDnsTextRecordPrivate>)
                                       &DAT_aaaaaaaaaaaaaaaa;
                                  QDnsDomainNameRecord::QDnsDomainNameRecord
                                            ((QDnsDomainNameRecord *)&record_1);
                                  if (*(int *)record_1.d.d.ptr != 1) {
                                    QSharedDataPointer<QDnsDomainNameRecordPrivate>::detach_helper
                                              ((QSharedDataPointer<QDnsDomainNameRecordPrivate> *)
                                               &record_1);
                                  }
                                  QString::operator=((QString *)((long)record_1.d.d.ptr + 8),
                                                     (QString *)&local_8f8);
                                  if (*(int *)record_1.d.d.ptr != 1) {
                                    QSharedDataPointer<QDnsDomainNameRecordPrivate>::detach_helper
                                              ((QSharedDataPointer<QDnsDomainNameRecordPrivate> *)
                                               &record_1);
                                  }
                                  *(uint *)((long)record_1.d.d.ptr + 0x20) = uVar24;
                                  QDnsLookupRunnable::query::anon_class_56_5_c3b57c2e::operator()
                                            ((QString *)&record,&local_8c8,lVar35);
                                  if (*(int *)record_1.d.d.ptr != 1) {
                                    QSharedDataPointer<QDnsDomainNameRecordPrivate>::detach_helper
                                              ((QSharedDataPointer<QDnsDomainNameRecordPrivate> *)
                                               &record_1);
                                  }
                                  QVar16.d.ptr = (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>
                                                  )((
                                                  totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>
                                                  *)((long)record_1.d.d.ptr + 0x28))->ptr;
                                  pcVar36 = *(char16_t **)((long)record_1.d.d.ptr + 0x30);
                                  ((QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate> *)
                                  ((long)record_1.d.d.ptr + 0x28))->d =
                                       (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>)
                                       record.d.d.ptr;
                                  *(char16_t **)((long)record_1.d.d.ptr + 0x30) = pcStack_910;
                                  qVar17 = *(qsizetype *)((long)record_1.d.d.ptr + 0x38);
                                  *(qsizetype *)((long)record_1.d.d.ptr + 0x38) = local_908;
                                  record.d.d.ptr =
                                       (QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>
                                        )(QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>
                                          )QVar16.d.ptr;
                                  if (QVar16.d.ptr != (QDnsTlsAssociationRecordPrivate *)0x0) {
                                    LOCK();
                                    *(int *)QVar16.d.ptr = *(int *)QVar16.d.ptr + -1;
                                    UNLOCK();
                                    if (*(int *)QVar16.d.ptr == 0) {
                                      QArrayData::deallocate((QArrayData *)QVar16.d.ptr,2,0x10);
                                    }
                                  }
                                  pcStack_910 = pcVar36;
                                  local_908 = qVar17;
                                  if (status < 0) {
                                    iVar32 = 0x27bc3c;
                                    goto LAB_00232da8;
                                  }
                                  this_01 = &reply_local->nameServerRecords;
                                  goto LAB_002327c6;
                                }
                              }
                              else {
                                if (uVar30 == 5) {
                                  record_1.d.d.ptr =
                                       (QSharedDataPointer<QDnsTextRecordPrivate>)
                                       &DAT_aaaaaaaaaaaaaaaa;
                                  QDnsDomainNameRecord::QDnsDomainNameRecord
                                            ((QDnsDomainNameRecord *)&record_1);
                                  if (*(int *)record_1.d.d.ptr != 1) {
                                    QSharedDataPointer<QDnsDomainNameRecordPrivate>::detach_helper
                                              ((QSharedDataPointer<QDnsDomainNameRecordPrivate> *)
                                               &record_1);
                                  }
                                  QString::operator=((QString *)((long)record_1.d.d.ptr + 8),
                                                     (QString *)&local_8f8);
                                  if (*(int *)record_1.d.d.ptr != 1) {
                                    QSharedDataPointer<QDnsDomainNameRecordPrivate>::detach_helper
                                              ((QSharedDataPointer<QDnsDomainNameRecordPrivate> *)
                                               &record_1);
                                  }
                                  *(uint *)((long)record_1.d.d.ptr + 0x20) = uVar24;
                                  QDnsLookupRunnable::query::anon_class_56_5_c3b57c2e::operator()
                                            ((QString *)&record,&local_8c8,lVar35);
                                  if (*(int *)record_1.d.d.ptr != 1) {
                                    QSharedDataPointer<QDnsDomainNameRecordPrivate>::detach_helper
                                              ((QSharedDataPointer<QDnsDomainNameRecordPrivate> *)
                                               &record_1);
                                  }
                                  QVar16.d.ptr = (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>
                                                  )((
                                                  totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>
                                                  *)((long)record_1.d.d.ptr + 0x28))->ptr;
                                  pcVar36 = *(char16_t **)((long)record_1.d.d.ptr + 0x30);
                                  ((QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate> *)
                                  ((long)record_1.d.d.ptr + 0x28))->d =
                                       (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>)
                                       record.d.d.ptr;
                                  *(char16_t **)((long)record_1.d.d.ptr + 0x30) = pcStack_910;
                                  qVar17 = *(qsizetype *)((long)record_1.d.d.ptr + 0x38);
                                  *(qsizetype *)((long)record_1.d.d.ptr + 0x38) = local_908;
                                  record.d.d.ptr =
                                       (QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>
                                        )(QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>
                                          )QVar16.d.ptr;
                                  if (QVar16.d.ptr != (QDnsTlsAssociationRecordPrivate *)0x0) {
                                    LOCK();
                                    *(int *)QVar16.d.ptr = *(int *)QVar16.d.ptr + -1;
                                    UNLOCK();
                                    if (*(int *)QVar16.d.ptr == 0) {
                                      QArrayData::deallocate((QArrayData *)QVar16.d.ptr,2,0x10);
                                    }
                                  }
                                  pcStack_910 = pcVar36;
                                  local_908 = qVar17;
                                  if (status < 0) {
                                    iVar32 = 0x27bc1e;
LAB_00232da8:
                                    pQVar19 = reply_local;
                                    QMetaObject::tr((char *)&record,
                                                    (char *)&QDnsLookup::staticMetaObject,iVar32);
                                    QDnsLookupReply::makeInvalidReplyError
                                              (pQVar19,(QString *)&record);
                                    if (record.d.d.ptr !=
                                        (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>)
                                        0x0) {
                                      LOCK();
                                      *(int *)record.d.d.ptr = *(int *)record.d.d.ptr + -1;
                                      UNLOCK();
                                      if (*(int *)record.d.d.ptr == 0) {
                                        QArrayData::deallocate((QArrayData *)record.d.d.ptr,2,0x10);
                                      }
                                    }
                                    QDnsDomainNameRecord::~QDnsDomainNameRecord
                                              ((QDnsDomainNameRecord *)&record_1);
                                    goto LAB_00232f1f;
                                  }
                                  this_01 = &reply_local->canonicalNameRecords;
                                }
                                else {
                                  if (uVar30 != 0xc) goto LAB_00232cfc;
                                  record_1.d.d.ptr =
                                       (QSharedDataPointer<QDnsTextRecordPrivate>)
                                       &DAT_aaaaaaaaaaaaaaaa;
                                  QDnsDomainNameRecord::QDnsDomainNameRecord
                                            ((QDnsDomainNameRecord *)&record_1);
                                  if (*(int *)record_1.d.d.ptr != 1) {
                                    QSharedDataPointer<QDnsDomainNameRecordPrivate>::detach_helper
                                              ((QSharedDataPointer<QDnsDomainNameRecordPrivate> *)
                                               &record_1);
                                  }
                                  QString::operator=((QString *)((long)record_1.d.d.ptr + 8),
                                                     (QString *)&local_8f8);
                                  if (*(int *)record_1.d.d.ptr != 1) {
                                    QSharedDataPointer<QDnsDomainNameRecordPrivate>::detach_helper
                                              ((QSharedDataPointer<QDnsDomainNameRecordPrivate> *)
                                               &record_1);
                                  }
                                  *(uint *)((long)record_1.d.d.ptr + 0x20) = uVar24;
                                  QDnsLookupRunnable::query::anon_class_56_5_c3b57c2e::operator()
                                            ((QString *)&record,&local_8c8,lVar35);
                                  if (*(int *)record_1.d.d.ptr != 1) {
                                    QSharedDataPointer<QDnsDomainNameRecordPrivate>::detach_helper
                                              ((QSharedDataPointer<QDnsDomainNameRecordPrivate> *)
                                               &record_1);
                                  }
                                  QVar16.d.ptr = (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>
                                                  )((
                                                  totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>
                                                  *)((long)record_1.d.d.ptr + 0x28))->ptr;
                                  pcVar36 = *(char16_t **)((long)record_1.d.d.ptr + 0x30);
                                  ((QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate> *)
                                  ((long)record_1.d.d.ptr + 0x28))->d =
                                       (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>)
                                       record.d.d.ptr;
                                  *(char16_t **)((long)record_1.d.d.ptr + 0x30) = pcStack_910;
                                  qVar17 = *(qsizetype *)((long)record_1.d.d.ptr + 0x38);
                                  *(qsizetype *)((long)record_1.d.d.ptr + 0x38) = local_908;
                                  record.d.d.ptr =
                                       (QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>
                                        )(QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>
                                          )QVar16.d.ptr;
                                  if (QVar16.d.ptr != (QDnsTlsAssociationRecordPrivate *)0x0) {
                                    LOCK();
                                    *(int *)QVar16.d.ptr = *(int *)QVar16.d.ptr + -1;
                                    UNLOCK();
                                    if (*(int *)QVar16.d.ptr == 0) {
                                      QArrayData::deallocate((QArrayData *)QVar16.d.ptr,2,0x10);
                                    }
                                  }
                                  pcStack_910 = pcVar36;
                                  local_908 = qVar17;
                                  if (status < 0) {
                                    iVar32 = 0x27bc57;
                                    goto LAB_00232da8;
                                  }
                                  this_01 = &reply_local->pointerRecords;
                                }
LAB_002327c6:
                                QList<QDnsDomainNameRecord>::append
                                          (this_01,(QDnsDomainNameRecord *)&record_1);
                                QDnsDomainNameRecord::~QDnsDomainNameRecord
                                          ((QDnsDomainNameRecord *)&record_1);
                              }
                            }
                            else if (uVar30 < 0x1c) {
                              if (uVar30 == 0xf) {
                                uVar7 = *(ushort *)(response + lVar1 + 10);
                                record_1.d.d.ptr =
                                     (QSharedDataPointer<QDnsTextRecordPrivate>)
                                     &DAT_aaaaaaaaaaaaaaaa;
                                QDnsMailExchangeRecord::QDnsMailExchangeRecord
                                          ((QDnsMailExchangeRecord *)&record_1);
                                QDnsLookupRunnable::query::anon_class_56_5_c3b57c2e::operator()
                                          ((QString *)&record,&local_8c8,lVar1 + 0xc);
                                if (*(int *)record_1.d.d.ptr != 1) {
                                  QSharedDataPointer<QDnsMailExchangeRecordPrivate>::detach_helper
                                            ((QSharedDataPointer<QDnsMailExchangeRecordPrivate> *)
                                             &record_1);
                                }
                                QVar16.d.ptr = (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>
                                                )((
                                                  totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>
                                                  *)((long)record_1.d.d.ptr + 0x28))->ptr;
                                pcVar36 = *(char16_t **)((long)record_1.d.d.ptr + 0x30);
                                ((QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate> *)
                                ((long)record_1.d.d.ptr + 0x28))->d =
                                     (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>)
                                     record.d.d.ptr;
                                *(char16_t **)((long)record_1.d.d.ptr + 0x30) = pcStack_910;
                                qVar17 = *(qsizetype *)((long)record_1.d.d.ptr + 0x38);
                                *(qsizetype *)((long)record_1.d.d.ptr + 0x38) = local_908;
                                record.d.d.ptr =
                                     (QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>)
                                     (QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>)
                                     QVar16.d.ptr;
                                if (QVar16.d.ptr != (QDnsTlsAssociationRecordPrivate *)0x0) {
                                  LOCK();
                                  *(int *)QVar16.d.ptr = *(int *)QVar16.d.ptr + -1;
                                  UNLOCK();
                                  if (*(int *)QVar16.d.ptr == 0) {
                                    QArrayData::deallocate((QArrayData *)QVar16.d.ptr,2,0x10);
                                  }
                                }
                                if (*(int *)record_1.d.d.ptr != 1) {
                                  QSharedDataPointer<QDnsMailExchangeRecordPrivate>::detach_helper
                                            ((QSharedDataPointer<QDnsMailExchangeRecordPrivate> *)
                                             &record_1);
                                }
                                QString::operator=((QString *)((long)record_1.d.d.ptr + 8),
                                                   (QString *)&local_8f8);
                                if (*(int *)record_1.d.d.ptr != 1) {
                                  QSharedDataPointer<QDnsMailExchangeRecordPrivate>::detach_helper
                                            ((QSharedDataPointer<QDnsMailExchangeRecordPrivate> *)
                                             &record_1);
                                }
                                *(ushort *)((long)record_1.d.d.ptr + 0x40) = uVar7 << 8 | uVar7 >> 8
                                ;
                                if (*(int *)record_1.d.d.ptr != 1) {
                                  QSharedDataPointer<QDnsMailExchangeRecordPrivate>::detach_helper
                                            ((QSharedDataPointer<QDnsMailExchangeRecordPrivate> *)
                                             &record_1);
                                }
                                pQVar19 = reply_local;
                                *(uint *)((long)record_1.d.d.ptr + 0x20) = uVar24;
                                pcStack_910 = pcVar36;
                                local_908 = qVar17;
                                if (status < 0) {
                                  QMetaObject::tr((char *)&record,
                                                  (char *)&QDnsLookup::staticMetaObject,0x27bc6e);
                                  QDnsLookupReply::makeInvalidReplyError(pQVar19,(QString *)&record)
                                  ;
                                  if (record.d.d.ptr !=
                                      (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>)
                                      0x0) {
                                    LOCK();
                                    *(int *)record.d.d.ptr = *(int *)record.d.d.ptr + -1;
                                    UNLOCK();
                                    if (*(int *)record.d.d.ptr == 0) {
                                      QArrayData::deallocate((QArrayData *)record.d.d.ptr,2,0x10);
                                    }
                                  }
                                  QDnsMailExchangeRecord::~QDnsMailExchangeRecord
                                            ((QDnsMailExchangeRecord *)&record_1);
                                  goto LAB_00232f1f;
                                }
                                QList<QDnsMailExchangeRecord>::append
                                          (&reply_local->mailExchangeRecords,
                                           (QDnsMailExchangeRecord *)&record_1);
                                QDnsMailExchangeRecord::~QDnsMailExchangeRecord
                                          ((QDnsMailExchangeRecord *)&record_1);
                              }
                              else if (uVar30 == 0x10) {
                                record_1.d.d.ptr =
                                     (QSharedDataPointer<QDnsTextRecordPrivate>)
                                     &DAT_aaaaaaaaaaaaaaaa;
                                QDnsTextRecord::QDnsTextRecord(&record_1);
                                if (*(int *)record_1.d.d.ptr != 1) {
                                  QSharedDataPointer<QDnsTextRecordPrivate>::detach_helper
                                            (&record_1.d);
                                }
                                QString::operator=((QString *)((long)record_1.d.d.ptr + 8),
                                                   (QString *)&local_8f8);
                                if (*(int *)record_1.d.d.ptr != 1) {
                                  QSharedDataPointer<QDnsTextRecordPrivate>::detach_helper
                                            (&record_1.d);
                                }
                                *(uint *)((long)record_1.d.d.ptr + 0x20) = uVar24;
                                if (uVar7 != 0) {
                                  do {
                                    pQVar19 = reply_local;
                                    bVar5 = response[lVar35];
                                    lVar29 = lVar35 + (ulong)bVar5 + 1;
                                    if (lVar2 < lVar29) {
                                      QMetaObject::tr((char *)&record,
                                                      (char *)&QDnsLookup::staticMetaObject,0x27bcc1
                                                     );
                                      QDnsLookupReply::makeInvalidReplyError
                                                (pQVar19,(QString *)&record);
                                      if (record.d.d.ptr !=
                                          (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>
                                           )0x0) {
                                        LOCK();
                                        *(int *)record.d.d.ptr = *(int *)record.d.d.ptr + -1;
                                        UNLOCK();
                                        if (*(int *)record.d.d.ptr == 0) {
                                          QArrayData::deallocate
                                                    ((QArrayData *)record.d.d.ptr,2,0x10);
                                        }
                                      }
                                      QDnsTextRecord::~QDnsTextRecord(&record_1);
                                      goto LAB_00232f1f;
                                    }
                                    if (record_1.d.d.ptr ==
                                        (totally_ordered_wrapper<QDnsTextRecordPrivate_*>)0x0) {
                                      QVar34.d.d.ptr =
                                           (QSharedDataPointer<QDnsTextRecordPrivate>)
                                           (totally_ordered_wrapper<QDnsTextRecordPrivate_*>)0x0;
                                    }
                                    else {
                                      QVar34.d.d.ptr = record_1.d.d.ptr;
                                      if (*(int *)record_1.d.d.ptr != 1) {
                                        QSharedDataPointer<QDnsTextRecordPrivate>::detach_helper
                                                  (&record_1.d);
                                        QVar34 = record_1;
                                      }
                                    }
                                    QByteArray::QByteArray
                                              ((QByteArray *)&record,(char *)(response + lVar35 + 1)
                                               ,(ulong)bVar5);
                                    QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray>
                                              ((QMovableArrayOps<QByteArray> *)
                                               ((long)QVar34.d.d.ptr + 0x28),
                                               *(qsizetype *)((long)QVar34.d.d.ptr + 0x38),
                                               (QByteArray *)&record);
                                    QList<QByteArray>::end
                                              ((QList<QByteArray> *)((long)QVar34.d.d.ptr + 0x28));
                                    if (record.d.d.ptr !=
                                        (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>)
                                        0x0) {
                                      LOCK();
                                      *(int *)record.d.d.ptr = *(int *)record.d.d.ptr + -1;
                                      UNLOCK();
                                      if (*(int *)record.d.d.ptr == 0) {
                                        QArrayData::deallocate((QArrayData *)record.d.d.ptr,1,0x10);
                                      }
                                    }
                                    lVar35 = lVar29;
                                  } while (lVar29 < lVar2);
                                }
                                QList<QDnsTextRecord>::append(&reply_local->textRecords,&record_1);
                                QDnsTextRecord::~QDnsTextRecord(&record_1);
                              }
                            }
                            else if (uVar30 == 0x1c) {
                              if (uVar7 != 0x1000) {
                                iVar32 = 0x27bc02;
LAB_00232a70:
                                QMetaObject::tr((char *)&record,
                                                (char *)&QDnsLookup::staticMetaObject,iVar32);
                                QDnsLookupReply::makeInvalidReplyError(pQVar19,(QString *)&record);
                                if (record.d.d.ptr !=
                                    (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>)0x0)
                                {
                                  LOCK();
                                  *(int *)record.d.d.ptr = *(int *)record.d.d.ptr + -1;
                                  UNLOCK();
                                  if (*(int *)record.d.d.ptr == 0) {
                                    QArrayData::deallocate((QArrayData *)record.d.d.ptr,2,0x10);
                                  }
                                }
LAB_00232f1f:
                                iVar32 = 1;
                                goto LAB_00232d0f;
                              }
                              record.d.d.ptr =
                                   (QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>)
                                   &DAT_aaaaaaaaaaaaaaaa;
                              QDnsHostAddressRecord::QDnsHostAddressRecord
                                        ((QDnsHostAddressRecord *)&record);
                              if (*(int *)record.d.d.ptr != 1) {
                                QSharedDataPointer<QDnsHostAddressRecordPrivate>::detach_helper
                                          ((QSharedDataPointer<QDnsHostAddressRecordPrivate> *)
                                           &record);
                              }
                              QString::operator=((QString *)((long)record.d.d.ptr + 8),
                                                 (QString *)&local_8f8);
                              if (*(int *)record.d.d.ptr != 1) {
                                QSharedDataPointer<QDnsHostAddressRecordPrivate>::detach_helper
                                          ((QSharedDataPointer<QDnsHostAddressRecordPrivate> *)
                                           &record);
                              }
                              *(uint *)((long)record.d.d.ptr + 0x20) = uVar24;
                              QHostAddress::QHostAddress
                                        ((QHostAddress *)&record_1,response + lVar35);
LAB_0023286d:
                              if (*(int *)record.d.d.ptr != 1) {
                                QSharedDataPointer<QDnsHostAddressRecordPrivate>::detach_helper
                                          ((QSharedDataPointer<QDnsHostAddressRecordPrivate> *)
                                           &record);
                              }
                              QVar15.d.ptr = (totally_ordered_wrapper<QDnsTextRecordPrivate_*>)
                                             ((totally_ordered_wrapper<QDnsTextRecordPrivate_*> *)
                                             ((long)record.d.d.ptr + 0x28))->ptr;
                              ((QSharedDataPointer<QDnsTextRecordPrivate> *)
                              ((long)record.d.d.ptr + 0x28))->d =
                                   (totally_ordered_wrapper<QDnsTextRecordPrivate_*>)
                                   record_1.d.d.ptr;
                              record_1.d.d.ptr =
                                   (QSharedDataPointer<QDnsTextRecordPrivate>)
                                   (QSharedDataPointer<QDnsTextRecordPrivate>)QVar15.d.ptr;
                              QHostAddress::~QHostAddress((QHostAddress *)&record_1);
                              QList<QDnsHostAddressRecord>::append
                                        (&reply_local->hostAddressRecords,(parameter_type)&record);
                              QDnsHostAddressRecord::~QDnsHostAddressRecord
                                        ((QDnsHostAddressRecord *)&record);
                            }
                            else if (uVar30 == 0x21) {
                              if (uVar31 < 7) {
                                iVar32 = 0x27bc8b;
                                goto LAB_00232a70;
                              }
                              uVar7 = *(ushort *)(response + lVar35);
                              uVar31 = *(ushort *)(response + lVar29 + 0xc);
                              uVar30 = *(ushort *)(response + lVar29 + 0xe);
                              record_1.d.d.ptr =
                                   (QSharedDataPointer<QDnsTextRecordPrivate>)&DAT_aaaaaaaaaaaaaaaa;
                              QDnsServiceRecord::QDnsServiceRecord((QDnsServiceRecord *)&record_1);
                              if (*(int *)record_1.d.d.ptr != 1) {
                                QSharedDataPointer<QDnsServiceRecordPrivate>::detach_helper
                                          ((QSharedDataPointer<QDnsServiceRecordPrivate> *)&record_1
                                          );
                              }
                              QString::operator=((QString *)((long)record_1.d.d.ptr + 8),
                                                 (QString *)&local_8f8);
                              QDnsLookupRunnable::query::anon_class_56_5_c3b57c2e::operator()
                                        ((QString *)&record,&local_8c8,lVar1 + 0x10);
                              if (*(int *)record_1.d.d.ptr != 1) {
                                QSharedDataPointer<QDnsServiceRecordPrivate>::detach_helper
                                          ((QSharedDataPointer<QDnsServiceRecordPrivate> *)&record_1
                                          );
                              }
                              QVar16.d.ptr = (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>
                                              )((totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>
                                                 *)((long)record_1.d.d.ptr + 0x28))->ptr;
                              pcVar36 = *(char16_t **)((long)record_1.d.d.ptr + 0x30);
                              ((QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate> *)
                              ((long)record_1.d.d.ptr + 0x28))->d =
                                   (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>)
                                   record.d.d.ptr;
                              *(char16_t **)((long)record_1.d.d.ptr + 0x30) = pcStack_910;
                              qVar17 = *(qsizetype *)((long)record_1.d.d.ptr + 0x38);
                              *(qsizetype *)((long)record_1.d.d.ptr + 0x38) = local_908;
                              record.d.d.ptr =
                                   (QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>)
                                   (QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>)
                                   QVar16.d.ptr;
                              if (QVar16.d.ptr != (QDnsTlsAssociationRecordPrivate *)0x0) {
                                LOCK();
                                *(int *)QVar16.d.ptr = *(int *)QVar16.d.ptr + -1;
                                UNLOCK();
                                if (*(int *)QVar16.d.ptr == 0) {
                                  QArrayData::deallocate((QArrayData *)QVar16.d.ptr,2,0x10);
                                }
                              }
                              if (*(int *)record_1.d.d.ptr != 1) {
                                QSharedDataPointer<QDnsServiceRecordPrivate>::detach_helper
                                          ((QSharedDataPointer<QDnsServiceRecordPrivate> *)&record_1
                                          );
                              }
                              *(ushort *)((long)record_1.d.d.ptr + 0x40) = uVar30 << 8 | uVar30 >> 8
                              ;
                              if (*(int *)record_1.d.d.ptr != 1) {
                                QSharedDataPointer<QDnsServiceRecordPrivate>::detach_helper
                                          ((QSharedDataPointer<QDnsServiceRecordPrivate> *)&record_1
                                          );
                              }
                              *(ushort *)((long)record_1.d.d.ptr + 0x42) = uVar7 << 8 | uVar7 >> 8;
                              if (*(int *)record_1.d.d.ptr != 1) {
                                QSharedDataPointer<QDnsServiceRecordPrivate>::detach_helper
                                          ((QSharedDataPointer<QDnsServiceRecordPrivate> *)&record_1
                                          );
                              }
                              *(uint *)((long)record_1.d.d.ptr + 0x20) = uVar24;
                              if (*(int *)record_1.d.d.ptr != 1) {
                                QSharedDataPointer<QDnsServiceRecordPrivate>::detach_helper
                                          ((QSharedDataPointer<QDnsServiceRecordPrivate> *)&record_1
                                          );
                              }
                              pQVar19 = reply_local;
                              *(ushort *)((long)record_1.d.d.ptr + 0x44) = uVar31 << 8 | uVar31 >> 8
                              ;
                              pcStack_910 = pcVar36;
                              local_908 = qVar17;
                              if (status < 0) {
                                QMetaObject::tr((char *)&record,
                                                (char *)&QDnsLookup::staticMetaObject,0x27bc8b);
                                QDnsLookupReply::makeInvalidReplyError(pQVar19,(QString *)&record);
                                if (record.d.d.ptr !=
                                    (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>)0x0)
                                {
                                  LOCK();
                                  *(int *)record.d.d.ptr = *(int *)record.d.d.ptr + -1;
                                  UNLOCK();
                                  if (*(int *)record.d.d.ptr == 0) {
                                    QArrayData::deallocate((QArrayData *)record.d.d.ptr,2,0x10);
                                  }
                                }
                                QDnsServiceRecord::~QDnsServiceRecord
                                          ((QDnsServiceRecord *)&record_1);
                                goto LAB_00232f1f;
                              }
                              QList<QDnsServiceRecord>::append
                                        (&reply_local->serviceRecords,(QDnsServiceRecord *)&record_1
                                        );
                              QDnsServiceRecord::~QDnsServiceRecord((QDnsServiceRecord *)&record_1);
                            }
                            else if (uVar30 == 0x34) {
                              if (uVar31 < 3) {
                                iVar32 = 0x27bca2;
                                goto LAB_00232a70;
                              }
                              uVar8 = *(undefined2 *)(response + lVar1 + 10);
                              uVar6 = response[lVar1 + 0xc];
                              record.d.d.ptr =
                                   (QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>)
                                   &DAT_aaaaaaaaaaaaaaaa;
                              QDnsTlsAssociationRecord::QDnsTlsAssociationRecord(&record);
                              QString::operator=((QString *)((long)record.d.d.ptr + 8),
                                                 (QString *)&local_8f8);
                              QVar18 = record;
                              *(uint *)((long)record.d.d.ptr + 0x20) = uVar24;
                              *(undefined2 *)((long)record.d.d.ptr + 0x24) = uVar8;
                              *(uchar *)((long)record.d.d.ptr + 0x26) = uVar6;
                              QArrayDataPointer<char>::assign<unsigned_char*,q20::identity>
                                        ((QArrayDataPointer<char> *)((long)record.d.d.ptr + 0x28),
                                         response + lVar29 + 0xd,response + lVar35 + (ulong)uVar31);
                              lVar37 = *(long *)((long)QVar18.d.d.ptr + 0x30);
                              if (lVar37 != 0) {
                                *(undefined1 *)(lVar37 + *(long *)((long)QVar18.d.d.ptr + 0x38)) = 0
                                ;
                              }
                              QList<QDnsTlsAssociationRecord>::append
                                        (&reply_local->tlsAssociationRecords,&record);
                              QDnsTlsAssociationRecord::~QDnsTlsAssociationRecord(&record);
                            }
LAB_00232cfc:
                            iVar23 = iVar23 + 1;
                            iVar32 = 0;
                            lVar37 = lVar2;
                          }
                          else {
                            iVar32 = 3;
                          }
                        }
                      }
                    }
LAB_00232d0f:
                    if (&(local_8f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_8f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_8f8.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_8f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate(&(local_8f8.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                  } while ((((iVar32 == 3) || (iVar32 == 0)) && (lVar37 < (int)local_88c)) &&
                          (iVar23 < (int)(uint)(ushort)(uVar22 << 8 | uVar22 >> 8)));
                }
              }
              else {
                local_8f8.d.d = (Data *)0x0;
                local_8f8.d.ptr = (char16_t *)0x0;
                local_8f8.d.size = 0;
                QDnsLookupReply::makeInvalidReplyError(reply_local,&local_8f8);
                if (&(local_8f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_8f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_8f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_8f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate(&(local_8f8.d.d)->super_QArrayData,2,0x10);
                  }
                }
              }
            }
            QArrayDataPointer<(anonymous_namespace)::QDnsCachedName>::~QArrayDataPointer
                      ((QArrayDataPointer<(anonymous_namespace)::QDnsCachedName> *)&local_8c8);
          }
          else {
            QDnsLookupReply::makeDnsRcodeError(reply_local,bVar5 & 0xf);
          }
        }
      }
    }
    if ((Data *)local_878._16_8_ != (Data *)(local_878 + 0x18)) {
      QtPrivate::sizedFree((void *)local_878._16_8_,local_878._0_8_);
    }
  }
  __res_nclose(&state);
LAB_00232f71:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar11) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDnsLookupRunnable::query(QDnsLookupReply *reply)
{
    // Initialize state.
    std::remove_pointer_t<res_state> state = {};
    if (res_ninit(&state) < 0) {
        int error = errno;
        qErrnoWarning(error, "QDnsLookup: Resolver initialization failed");
        return reply->makeResolverSystemError(error);
    }
    auto guard = qScopeGuard([&] { res_nclose(&state); });

#ifdef QDNSLOOKUP_DEBUG
    state.options |= RES_DEBUG;
#endif

    // Prepare the DNS query.
    QueryBuffer qbuffer;
    int queryLength = prepareQueryBuffer(&state, qbuffer, requestName.constData(), ns_rcode(requestType));
    if (Q_UNLIKELY(queryLength < 0))
        return reply->makeResolverSystemError();

    // Perform DNS query.
    QSpan query(qbuffer.data(), queryLength);
    ReplyBuffer buffer(ReplyBufferSize);
    int responseLength = -1;
    switch (protocol) {
    case QDnsLookup::Standard:
        responseLength = sendStandardDns(reply, &state, query, buffer, nameserver, port);
        break;
    case QDnsLookup::DnsOverTls:
        if (!sendDnsOverTls(reply, query, buffer))
            return;
        responseLength = buffer.size();
        break;
    }

    if (responseLength < 0)
        return;

    // Check the reply is valid.
    if (responseLength < int(sizeof(HEADER)))
        return reply->makeInvalidReplyError();

    // Parse the reply.
    auto header = reinterpret_cast<HEADER *>(buffer.data());
    if (header->rcode)
        return reply->makeDnsRcodeError(header->rcode);

    qptrdiff offset = sizeof(HEADER);
    unsigned char *response = buffer.data();
    int status;

    auto expandHost = [&, cache = Cache{}](qptrdiff offset) mutable {
        if (uchar n = response[offset]; n & NS_CMPRSFLGS) {
            // compressed name, see if we already have it cached
            if (offset + 1 < responseLength) {
                int id = ((n & ~NS_CMPRSFLGS) << 8) | response[offset + 1];
                auto it = std::find_if(cache.constBegin(), cache.constEnd(),
                                  [id](const QDnsCachedName &n) { return n.code == id; });
                if (it != cache.constEnd()) {
                    status = 2;
                    return it->name;
                }
            }
        }

        // uncached, expand it
        char host[MAXCDNAME + 1];
        status = dn_expand(response, response + responseLength, response + offset,
                           host, sizeof(host));
        if (status >= 0)
            return cache.emplaceBack(decodeLabel(QLatin1StringView(host)), offset).name;

        // failed
        reply->makeInvalidReplyError(QDnsLookup::tr("Could not expand domain name"));
        return QString();
    };

    if (ntohs(header->qdcount) == 1) {
        // Skip the query host, type (2 bytes) and class (2 bytes).
        expandHost(offset);
        if (status < 0)
            return;
        if (offset + status + 4 > responseLength)
            header->qdcount = 0xffff;   // invalid reply below
        else
            offset += status + 4;
    }
    if (ntohs(header->qdcount) > 1)
        return reply->makeInvalidReplyError();

    // Extract results.
    const int answerCount = ntohs(header->ancount);
    int answerIndex = 0;
    while ((offset < responseLength) && (answerIndex < answerCount)) {
        const QString name = expandHost(offset);
        if (status < 0)
            return;

        offset += status;
        if (offset + RRFIXEDSZ > responseLength) {
            // probably just a truncated reply, return what we have
            return;
        }
        const quint16 type = qFromBigEndian<quint16>(response + offset);
        const qint16 rrclass = qFromBigEndian<quint16>(response + offset + 2);
        const quint32 ttl = qFromBigEndian<quint32>(response + offset + 4);
        const quint16 size = qFromBigEndian<quint16>(response + offset + 8);
        offset += RRFIXEDSZ;
        if (offset + size > responseLength)
            return;             // truncated
        if (rrclass != C_IN)
            continue;

        if (type == QDnsLookup::A) {
            if (size != 4)
                return reply->makeInvalidReplyError(QDnsLookup::tr("Invalid IPv4 address record"));
            const quint32 addr = qFromBigEndian<quint32>(response + offset);
            QDnsHostAddressRecord record;
            record.d->name = name;
            record.d->timeToLive = ttl;
            record.d->value = QHostAddress(addr);
            reply->hostAddressRecords.append(record);
        } else if (type == QDnsLookup::AAAA) {
            if (size != 16)
                return reply->makeInvalidReplyError(QDnsLookup::tr("Invalid IPv6 address record"));
            QDnsHostAddressRecord record;
            record.d->name = name;
            record.d->timeToLive = ttl;
            record.d->value = QHostAddress(response + offset);
            reply->hostAddressRecords.append(record);
        } else if (type == QDnsLookup::CNAME) {
            QDnsDomainNameRecord record;
            record.d->name = name;
            record.d->timeToLive = ttl;
            record.d->value = expandHost(offset);
            if (status < 0)
                return reply->makeInvalidReplyError(QDnsLookup::tr("Invalid canonical name record"));
            reply->canonicalNameRecords.append(record);
        } else if (type == QDnsLookup::NS) {
            QDnsDomainNameRecord record;
            record.d->name = name;
            record.d->timeToLive = ttl;
            record.d->value = expandHost(offset);
            if (status < 0)
                return reply->makeInvalidReplyError(QDnsLookup::tr("Invalid name server record"));
            reply->nameServerRecords.append(record);
        } else if (type == QDnsLookup::PTR) {
            QDnsDomainNameRecord record;
            record.d->name = name;
            record.d->timeToLive = ttl;
            record.d->value = expandHost(offset);
            if (status < 0)
                return reply->makeInvalidReplyError(QDnsLookup::tr("Invalid pointer record"));
            reply->pointerRecords.append(record);
        } else if (type == QDnsLookup::MX) {
            const quint16 preference = qFromBigEndian<quint16>(response + offset);
            QDnsMailExchangeRecord record;
            record.d->exchange = expandHost(offset + 2);
            record.d->name = name;
            record.d->preference = preference;
            record.d->timeToLive = ttl;
            if (status < 0)
                return reply->makeInvalidReplyError(QDnsLookup::tr("Invalid mail exchange record"));
            reply->mailExchangeRecords.append(record);
        } else if (type == QDnsLookup::SRV) {
            if (size < 7)
                return reply->makeInvalidReplyError(QDnsLookup::tr("Invalid service record"));
            const quint16 priority = qFromBigEndian<quint16>(response + offset);
            const quint16 weight = qFromBigEndian<quint16>(response + offset + 2);
            const quint16 port = qFromBigEndian<quint16>(response + offset + 4);
            QDnsServiceRecord record;
            record.d->name = name;
            record.d->target = expandHost(offset + 6);
            record.d->port = port;
            record.d->priority = priority;
            record.d->timeToLive = ttl;
            record.d->weight = weight;
            if (status < 0)
                return reply->makeInvalidReplyError(QDnsLookup::tr("Invalid service record"));
            reply->serviceRecords.append(record);
        } else if (type == QDnsLookup::TLSA) {
            // https://datatracker.ietf.org/doc/html/rfc6698#section-2.1
            if (size < 3)
                return reply->makeInvalidReplyError(QDnsLookup::tr("Invalid TLS association record"));

            const quint8 usage = response[offset];
            const quint8 selector = response[offset + 1];
            const quint8 matchType = response[offset + 2];

            QDnsTlsAssociationRecord record;
            record.d->name = name;
            record.d->timeToLive = ttl;
            record.d->usage = QDnsTlsAssociationRecord::CertificateUsage(usage);
            record.d->selector = QDnsTlsAssociationRecord::Selector(selector);
            record.d->matchType = QDnsTlsAssociationRecord::MatchingType(matchType);
            record.d->value.assign(response + offset + 3, response + offset + size);
            reply->tlsAssociationRecords.append(std::move(record));
        } else if (type == QDnsLookup::TXT) {
            QDnsTextRecord record;
            record.d->name = name;
            record.d->timeToLive = ttl;
            qptrdiff txt = offset;
            while (txt < offset + size) {
                const unsigned char length = response[txt];
                txt++;
                if (txt + length > offset + size)
                    return reply->makeInvalidReplyError(QDnsLookup::tr("Invalid text record"));
                record.d->values << QByteArrayView(response + txt, length).toByteArray();
                txt += length;
            }
            reply->textRecords.append(record);
        }
        offset += size;
        answerIndex++;
    }
}